

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O2

void usage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," [options] file.pdf [password]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Options:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --numbers        give bookmarks outline-style numbers");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --lines          draw lines to show bookmark hierarchy");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --show-open      indicate whether a bookmark is initially open"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  --show-targets   show target if possible");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(2);
}

Assistant:

void
usage()
{
    std::cerr << "Usage: " << whoami << " [options] file.pdf [password]" << std::endl
              << "Options:" << std::endl
              << "  --numbers        give bookmarks outline-style numbers" << std::endl
              << "  --lines          draw lines to show bookmark hierarchy" << std::endl
              << "  --show-open      indicate whether a bookmark is initially open" << std::endl
              << "  --show-targets   show target if possible" << std::endl;
    exit(2);
}